

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O0

void test_set_diagonal(GlobalArray *g_a,GlobalArray *g_v)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  GAServices *this;
  DoubleComplex DVar7;
  int vdims [7];
  int vndim;
  int vtype;
  int dims [7];
  int ndim;
  int type;
  DoubleComplex zresult;
  DoubleComplex zdot;
  double dresult;
  double fresult;
  double ddot;
  double fdot;
  int lresult;
  int ldot;
  int iresult;
  int idot;
  DoubleComplex dcval;
  long lval;
  float fval;
  double dval;
  int ival;
  void *val;
  int me;
  GlobalArray *in_stack_fffffffffffffeb8;
  GAServices *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  GlobalArray *in_stack_fffffffffffffed0;
  int local_128;
  int local_124;
  double local_108;
  double local_100;
  int local_f8;
  int local_c8;
  undefined4 local_a4;
  double local_50;
  double local_48;
  double local_40;
  float local_34;
  double local_30;
  int local_24;
  double *local_20;
  int local_14;
  
  local_14 = GA_Nodeid();
  local_24 = -2;
  local_30 = -2.0;
  local_34 = -2.0;
  local_40 = -NAN;
  GA::GlobalArray::inquire
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0,
             &in_stack_fffffffffffffeb8->mHandle);
  GA::GlobalArray::inquire
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0,
             &in_stack_fffffffffffffeb8->mHandle);
  local_50 = -2.0;
  local_48 = -0.0;
  switch(local_a4) {
  case 0x3e9:
    local_20 = (double *)&local_24;
    break;
  case 0x3ea:
    local_20 = &local_40;
    break;
  case 0x3eb:
    local_20 = (double *)&local_34;
    break;
  case 0x3ec:
    local_20 = &local_30;
    break;
  default:
    GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
    break;
  case 0x3ef:
    local_20 = &local_50;
  }
  if (local_14 == 0) {
    printf("Testing GA_Set_diagonal...");
  }
  GA::GlobalArray::zero((GlobalArray *)0x107df2);
  GA::GlobalArray::fill((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  GA::GlobalArray::setDiagonal((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  switch(local_a4) {
  case 0x3e9:
    local_124 = local_f8 * local_24 * local_24;
    iVar1 = GA::GlobalArray::idot
                      ((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (local_14 == 0) {
      if (local_124 - iVar1 < 0) {
        local_124 = -(local_124 - iVar1);
      }
      else {
        local_124 = local_124 - iVar1;
      }
      if ((double)local_124 < 1e-05) {
        printf("ok.\n");
      }
      else {
        printf("not ok.\n");
        GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
      }
    }
    break;
  case 0x3ea:
    local_128 = local_f8 * SUB84(local_40,0) * SUB84(local_40,0);
    lVar2 = GA::GlobalArray::ldot
                      ((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    iVar1 = (int)lVar2;
    if (local_14 == 0) {
      if (local_128 - iVar1 < 0) {
        local_128 = -(local_128 - iVar1);
      }
      else {
        local_128 = local_128 - iVar1;
      }
      if ((double)local_128 < 1e-05) {
        printf("ok.\n");
      }
      else {
        printf("not ok.\n");
        GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
      }
    }
    break;
  case 0x3eb:
    fVar3 = (float)local_f8 * local_34 * local_34;
    fVar4 = GA::GlobalArray::fdot
                      ((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (local_14 == 0) {
      if (fVar3 - fVar4 < 0.0) {
        fVar3 = -(fVar3 - fVar4);
      }
      else {
        fVar3 = fVar3 - fVar4;
      }
      if (fVar3 < 1e-05) {
        printf("ok.\n");
      }
      else {
        printf("not ok.\n");
        GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
      }
    }
    break;
  case 0x3ec:
    dVar5 = (double)local_f8 * local_30 * local_30;
    dVar6 = GA::GlobalArray::ddot
                      ((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (local_14 == 0) {
      if (dVar5 - dVar6 < 0.0) {
        dVar5 = -(dVar5 - dVar6);
      }
      else {
        dVar5 = dVar5 - dVar6;
      }
      if (dVar5 < 1e-05) {
        printf("ok.\n");
      }
      else {
        printf("not ok.\n");
        GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
      }
    }
    break;
  default:
    GA::GAServices::error(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,0);
    break;
  case 0x3ef:
    dVar5 = (double)local_f8 * (local_50 * local_50 + -(local_48 * local_48));
    dVar6 = (double)local_c8 * local_50 * 2.0 * local_48;
    DVar7 = GA::GlobalArray::zdot
                      ((GlobalArray *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_108 = DVar7.real;
    local_100 = DVar7.imag;
    if (local_14 == 0) {
      if (dVar5 - local_108 < 0.0) {
        this = (GAServices *)-(dVar5 - local_108);
      }
      else {
        this = (GAServices *)(dVar5 - local_108);
      }
      if ((double)this < 1e-05) {
        if (dVar6 - local_100 < 0.0) {
          in_stack_fffffffffffffeb8 = (GlobalArray *)-(dVar6 - local_100);
        }
        else {
          in_stack_fffffffffffffeb8 = (GlobalArray *)(dVar6 - local_100);
        }
        if ((double)in_stack_fffffffffffffeb8 < 1e-05) {
          printf("ok.\n");
          return;
        }
      }
      printf("not ok.\n");
      GA::GAServices::error(this,(char *)in_stack_fffffffffffffeb8,0);
    }
  }
  return;
}

Assistant:

void 
test_set_diagonal (GA::GlobalArray * g_a, 
		   GA::GlobalArray * g_v)  {
  

  int me = GA_Nodeid ();
  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  int idot, iresult, ldot, lresult;
  double fdot, ddot, fresult, dresult;
  DoubleComplex zdot, zresult;

  int type, ndim, dims[MAXDIM];
  int vtype, vndim, vdims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);
  g_v->inquire (&vtype, &vndim, vdims);
  dcval.real = -2.0;
  dcval.imag = -0.0;

  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      break;
    case C_DBL:
      val = (void *)&dval;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      break;
    case C_LONG:
      val =(void *) &lval;
      break;
    default:
      GA::SERVICES.error ((char *)"test_set_diagonal:wrong data type.", type);
    }


  if (me == 0)
    printf ("Testing GA_Set_diagonal...");
  g_a->zero ();
  g_v->fill (val);
  g_a->setDiagonal (g_v);

  switch (type)
    {
    case C_INT:
      idot = vdims[0] * ival * ival;
      iresult = g_a->idot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (idot, iresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      ldot = ((long) vdims[0]) * lval * lval;
      lresult = g_a->ldot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (ldot, lresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      fdot = ((float) vdims[0]) * fval * fval;
      fresult = g_a->fdot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (fdot, fresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      ddot = ((double) vdims[0]) * dval * dval;
      dresult = g_a->ddot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (ddot, dresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      zdot.real =
	((double) vdims[0]) * (dcval.real * dcval.real -
			       dcval.imag * dcval.imag);
      zdot.imag = ((double) dims[0]) * (2.0 * dcval.real * dcval.imag);
      zresult = g_a->zdot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (zdot.real, zresult.real)
	      || MISMATCHED (zdot.imag, zresult.imag)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_set_diagonal:wrong data type:", type);
    }

}